

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

void __thiscall DPlat::Tick(DPlat *this)

{
  EPlatType EVar1;
  sector_t *psVar2;
  EMoveResult EVar3;
  int iVar4;
  double dVar5;
  EMoveResult res;
  DPlat *this_local;
  
  switch(this->m_Status) {
  case up:
    EVar3 = sector_t::MoveFloor((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector
                                ,this->m_Speed,this->m_High,this->m_Crush,1,false);
    if ((EVar3 == crushed) && (this->m_Crush == -1)) {
      this->m_Count = this->m_Wait;
      this->m_Status = down;
      PlayPlatSound(this,"Platform");
    }
    else if (EVar3 == pastdest) {
      SN_StopSequence((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1);
      if (this->m_Type == platToggle) {
        this->m_OldStatus = this->m_Status;
        this->m_Status = in_stasis;
      }
      else {
        this->m_Count = this->m_Wait;
        this->m_Status = waiting;
        EVar1 = this->m_Type;
        if ((((1 < EVar1 - platDownWaitUpStay) && (EVar1 != platDownByValue)) &&
            (1 < EVar1 - platUpByValueStay)) && (1 < EVar1 - platDownToNearestFloor)) {
          if (EVar1 != platRaiseAndStayLockout) {
            return;
          }
          psVar2 = (this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector;
          psVar2->planes[0].Flags = psVar2->planes[0].Flags | 2;
        }
        (*(this->super_DMovingFloor).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
          _vptr_DObject[4])();
      }
    }
    break;
  case down:
    EVar3 = sector_t::MoveFloor((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector
                                ,this->m_Speed,this->m_Low,-1,-1,false);
    if (EVar3 == pastdest) {
      SN_StopSequence((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1);
      if (this->m_Type == platToggle) {
        this->m_OldStatus = this->m_Status;
        this->m_Status = in_stasis;
      }
      else {
        this->m_Count = this->m_Wait;
        this->m_Status = waiting;
        if ((this->m_Type - platUpWaitDownStay < 2) || (this->m_Type == platUpByValue)) {
          (*(this->super_DMovingFloor).super_DMover.super_DSectorEffect.super_DThinker.super_DObject
            ._vptr_DObject[4])();
        }
      }
    }
    else if (((EVar3 == crushed) && (this->m_Crush < 0)) && (this->m_Type != platToggle)) {
      this->m_Status = up;
      this->m_Count = this->m_Wait;
      PlayPlatSound(this,"Platform");
    }
    if ((this->m_Type - platUpByValueStay < 2) || (this->m_Type == platRaiseAndStayLockout)) {
      (*(this->super_DMovingFloor).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
        _vptr_DObject[4])();
    }
    break;
  case waiting:
    if ((0 < this->m_Count) && (iVar4 = this->m_Count + -1, this->m_Count = iVar4, iVar4 == 0)) {
      dVar5 = secplane_t::fD(&((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector)
                              ->floorplane);
      if ((dVar5 != this->m_Low) || (NAN(dVar5) || NAN(this->m_Low))) {
        this->m_Status = down;
      }
      else {
        this->m_Status = up;
      }
      if (this->m_Type == platToggle) {
        SN_StartSequence((this->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector,1,
                         "Silence",0);
      }
      else {
        PlayPlatSound(this,"Platform");
      }
    }
    break;
  case in_stasis:
  }
  return;
}

Assistant:

void DPlat::Tick ()
{
	EMoveResult res;
		
	switch (m_Status)
	{
	case up:
		res = m_Sector->MoveFloor (m_Speed, m_High, m_Crush, 1, false);
										
		if (res == EMoveResult::crushed && (m_Crush == -1))
		{
			m_Count = m_Wait;
			m_Status = down;
			PlayPlatSound ("Platform");
		}
		else if (res == EMoveResult::pastdest)
		{
			SN_StopSequence (m_Sector, CHAN_FLOOR);
			if (m_Type != platToggle)
			{
				m_Count = m_Wait;
				m_Status = waiting;

				switch (m_Type)
				{
					case platRaiseAndStayLockout:
						// Instead of keeping the dead thinker like Heretic did let's 
						// better use a flag to avoid problems elsewhere. For example,
						// keeping the thinker would make tagwait wait indefinitely.
						m_Sector->planes[sector_t::floor].Flags |= PLANEF_BLOCKED; 
					case platRaiseAndStay:
					case platDownByValue:
					case platDownWaitUpStay:
					case platDownWaitUpStayStone:
					case platUpByValueStay:
					case platDownToNearestFloor:
					case platDownToLowestCeiling:
						Destroy ();
						break;
					default:
						break;
				}
			}
			else
			{
				m_OldStatus = m_Status;		//jff 3/14/98 after action wait  
				m_Status = in_stasis;		//for reactivation of toggle
			}
		}
		break;
		
	case down:
		res = m_Sector->MoveFloor (m_Speed, m_Low, -1, -1, false);

		if (res == EMoveResult::pastdest)
		{
			SN_StopSequence (m_Sector, CHAN_FLOOR);
			// if not an instant toggle, start waiting
			if (m_Type != platToggle)		//jff 3/14/98 toggle up down
			{								// is silent, instant, no waiting
				m_Count = m_Wait;
				m_Status = waiting;

				switch (m_Type)
				{
					case platUpWaitDownStay:
					case platUpNearestWaitDownStay:
					case platUpByValue:
						Destroy ();
						break;
					default:
						break;
				}
			}
			else
			{	// instant toggles go into stasis awaiting next activation
				m_OldStatus = m_Status;		//jff 3/14/98 after action wait  
				m_Status = in_stasis;		//for reactivation of toggle
			}
		}
		else if (res == EMoveResult::crushed && m_Crush < 0 && m_Type != platToggle)
		{
			m_Status = up;
			m_Count = m_Wait;
			PlayPlatSound ("Platform");
		}

		//jff 1/26/98 remove the plat if it bounced so it can be tried again
		//only affects plats that raise and bounce

		// remove the plat if it's a pure raise type
		switch (m_Type)
		{
			case platUpByValueStay:
			case platRaiseAndStay:
			case platRaiseAndStayLockout:
				Destroy ();
			default:
				break;
		}

		break;
		
	case waiting:
		if (m_Count > 0 && !--m_Count)
		{
			if (m_Sector->floorplane.fD() == m_Low)
				m_Status = up;
			else
				m_Status = down;

			if (m_Type == platToggle)
				SN_StartSequence (m_Sector, CHAN_FLOOR, "Silence", 0);
			else
				PlayPlatSound ("Platform");
		}
		break;

	case in_stasis:
		break;
	}
}